

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting_sort_benchmark.cpp
# Opt level: O2

int main(void)

{
  bitsPerElementVSbucketSize();
  return 0;
}

Assistant:

int main() {
//    writeFilePerformance();
    bitsPerElementVSbucketSize();
    return 0;
    std::mt19937 eng(42);
    std::uniform_int_distribution <uint16_t> distr;

    for(int i=1; i<=128; i<<=1) {
        unsigned els = i * 1024 * 1024 / 4;
        vector<uint16_t> orig;
        orig.reserve(els);

        for (int a = 0; a < els; a++) {
            orig.push_back(distr(eng));
        }

        vector<uint16_t> copy(orig);

        relClockOffset();
//        cerr << "radix...";
//        cerr <<"sorting...\n";
        kx::radix_sort(copy.begin(), copy.end());
//        cerr<<relClockOffset();
        cerr << "kx " << els * 2 / 1024.0 / 1024.0 << "MB chunk : \t" << els * 2 / 1024.0 / 1024.0 / relClockOffset() << " mb/s"<< "\n";

        copy = orig;
        vector<unsigned> cnt(65536,0);
        relClockOffset();

        for(auto x: orig) {
            cnt[x]++;
        }

        copy.resize(0);

        for(int a=0;a<65536;a++) {
            auto tot = cnt[a];
            for(int i=0;i<tot;i++) {
                copy.push_back(a);
            }
        }

        cerr << "counting " << els * 2 / 1024.0 / 1024.0 << "MB chunk : \t" << els * 2 / 1024.0 / 1024.0 / relClockOffset() << " mb/s"<< "\n";

//        copy = orig;
//        relClockOffset();
//
//        cerr << "stl sort...";
//
//        sort(copy.begin(), copy.end());
//
//        cerr << "stl " << els * 2 / 1024.0 / 1024.0 << "MB chunk : \t" << els * 2 / 1024.0 / 1024.0 / relClockOffset() << " mb/s"<< "\n\n";
    }
}